

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condition_variable_fwd.hpp
# Opt level: O1

void __thiscall boost::condition_variable::~condition_variable(condition_variable *this)

{
  int iVar1;
  
  do {
    iVar1 = pthread_mutex_destroy((pthread_mutex_t *)this);
  } while (iVar1 == 4);
  if (iVar1 != 0) {
    __assert_fail("!ret",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/thread/pthread/condition_variable_fwd.hpp"
                  ,0x72,"boost::condition_variable::~condition_variable()");
  }
  do {
    iVar1 = pthread_cond_destroy((pthread_cond_t *)&this->cond);
  } while (iVar1 == 4);
  if (iVar1 == 0) {
    return;
  }
  __assert_fail("!ret",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/thread/pthread/condition_variable_fwd.hpp"
                ,0x77,"boost::condition_variable::~condition_variable()");
}

Assistant:

~condition_variable()
        {
            int ret;
//#if defined BOOST_THREAD_PROVIDES_INTERRUPTIONS
            // ditto
            do {
              ret = pthread_mutex_destroy(&internal_mutex);
            } while (ret == EINTR);
            BOOST_ASSERT(!ret);
//#endif
            do {
              ret = pthread_cond_destroy(&cond);
            } while (ret == EINTR);
            BOOST_ASSERT(!ret);
        }